

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-conversion.cc
# Opt level: O0

bool __thiscall
EncodingConversion::decode
          (EncodingConversion *this,u16string *string,FILE *stream,
          vector<char,_std::allocator<char>_> *input_vector,
          function<void_(unsigned_long)> *progress_callback)

{
  int iVar1;
  char *input_start;
  size_type sVar2;
  size_t sVar3;
  ulong input_length;
  size_t sVar4;
  size_t bytes_appended;
  size_t bytes_to_append;
  size_t bytes_read;
  size_t bytes_to_read;
  size_t total_bytes_read;
  size_t bytes_left_over;
  char *input_buffer;
  function<void_(unsigned_long)> *progress_callback_local;
  vector<char,_std::allocator<char>_> *input_vector_local;
  FILE *stream_local;
  u16string *string_local;
  EncodingConversion *this_local;
  
  input_start = std::vector<char,_std::allocator<char>_>::data(input_vector);
  total_bytes_read = 0;
  bytes_to_read = 0;
  while( true ) {
    sVar2 = std::vector<char,_std::allocator<char>_>::size(input_vector);
    sVar3 = fread(input_start + total_bytes_read,1,sVar2 - total_bytes_read,(FILE *)stream);
    if ((sVar3 < sVar2 - total_bytes_read) && (iVar1 = ferror((FILE *)stream), iVar1 != 0)) break;
    input_length = total_bytes_read + sVar3;
    if (input_length == 0) {
      return true;
    }
    sVar4 = decode(this,string,input_start,input_length,sVar3 == 0);
    bytes_to_read = sVar4 + bytes_to_read;
    std::function<void_(unsigned_long)>::operator()(progress_callback,bytes_to_read);
    if (sVar4 < input_length) {
      std::copy<char*,char*>(input_start + sVar4,input_start + input_length,input_start);
    }
    total_bytes_read = input_length - sVar4;
  }
  return false;
}

Assistant:

bool EncodingConversion::decode(u16string &string, FILE *stream,
                                vector<char> &input_vector,
                                function<void(size_t)> progress_callback) {
  char *input_buffer = input_vector.data();
  size_t bytes_left_over = 0;
  size_t total_bytes_read = 0;

  for (;;) {
    size_t bytes_to_read = input_vector.size() - bytes_left_over;
    size_t bytes_read = fread(input_buffer + bytes_left_over, 1, bytes_to_read, stream);
    if (bytes_read < bytes_to_read && ferror(stream)) return false;
    size_t bytes_to_append = bytes_left_over + bytes_read;
    if (bytes_to_append == 0) break;

    size_t bytes_appended = decode(
      string,
      input_buffer,
      bytes_to_append,
      bytes_read == 0
    );

    total_bytes_read += bytes_appended;
    progress_callback(total_bytes_read);

    if (bytes_appended < bytes_to_append) {
      std::copy(input_buffer + bytes_appended, input_buffer + bytes_to_append, input_buffer);
    }

    bytes_left_over = bytes_to_append - bytes_appended;
  }

  return true;
}